

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lyplg_ext_pfree_instance_substatements(ly_ctx *ctx,lysp_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysp_node *plVar3;
  void **ppvVar4;
  lysp_type **local_198;
  ulong local_188;
  ulong local_178;
  ulong local_168;
  ulong local_158;
  ulong local_148;
  ulong local_138;
  ulong local_128;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  ulong local_e8;
  lyd_node **local_d0;
  lysp_type **type_p;
  uint64_t c___11;
  uint64_t c___10;
  uint64_t c___9;
  uint64_t c___8;
  uint64_t c___7;
  uint64_t c___6;
  uint64_t c___5;
  uint64_t c___4;
  uint64_t c___3;
  uint64_t c___2;
  uint64_t c___1;
  uint64_t c__;
  lysp_node *child_next;
  lysp_node *child;
  undefined1 auStack_40 [7];
  ly_bool node_free;
  lysf_ctx fctx;
  uint64_t u;
  lysp_ext_substmt *substmts_local;
  ly_ctx *ctx_local;
  
  memset(auStack_40,0,0x20);
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  _auStack_40 = ctx;
  do {
    if (substmts == (lysp_ext_substmt *)0x0) {
      local_d0 = (lyd_node **)0x0;
    }
    else {
      local_d0 = (lyd_node **)substmts[-1].storage_p;
    }
    if (local_d0 <= fctx.ext_set.field_2.dnodes) {
      if (substmts != (lysp_ext_substmt *)0x0) {
        free(&substmts[-1].storage_p);
      }
      return;
    }
    if (substmts[(long)fctx.ext_set.field_2].storage_p != (void **)0x0) {
      lVar2 = substmts[(long)fctx.ext_set.field_2].stmt;
      if (((((((lVar2 - LY_STMT_NOTIFICATION < 2) || (lVar2 == LY_STMT_OUTPUT)) ||
             (lVar2 == LY_STMT_ACTION)) || ((lVar2 == LY_STMT_RPC || (lVar2 == LY_STMT_ANYDATA))))
           || (lVar2 == LY_STMT_ANYXML)) ||
          (((lVar2 == LY_STMT_AUGMENT || (lVar2 == LY_STMT_CASE)) ||
           ((lVar2 == LY_STMT_CHOICE ||
            (((lVar2 == LY_STMT_CONTAINER || (lVar2 == LY_STMT_GROUPING)) || (lVar2 == LY_STMT_LEAF)
             ))))))) ||
         (((lVar2 == LY_STMT_LEAF_LIST || (lVar2 == LY_STMT_LIST)) || (lVar2 == LY_STMT_USES)))) {
        plVar3 = (lysp_node *)*substmts[(long)fctx.ext_set.field_2].storage_p;
        while (child_next = plVar3, child_next != (lysp_node *)0x0) {
          plVar3 = child_next->next;
          uVar1 = child_next->nodetype;
          lysp_node_free((lysf_ctx *)auStack_40,child_next);
          if ((uVar1 & 0x3000) != 0) {
            free(child_next);
          }
        }
        *substmts[(long)fctx.ext_set.field_2].storage_p = (void *)0x0;
      }
      else if (lVar2 == LY_STMT_ARGUMENT) {
LAB_0019ac8f:
        lydict_remove(ctx,(char *)*substmts[(long)fctx.ext_set.field_2].storage_p);
      }
      else if (lVar2 == LY_STMT_BASE) {
        c___1 = 0;
        while( true ) {
          if (**substmts[(long)fctx.ext_set.field_2].storage_p == 0) {
            local_e8 = 0;
          }
          else {
            local_e8 = *(ulong *)(**substmts[(long)fctx.ext_set.field_2].storage_p + -8);
          }
          if (local_e8 <= c___1) break;
          lydict_remove(ctx,(char *)(**substmts[(long)fctx.ext_set.field_2].storage_p + c___1));
          c___1 = c___1 + 1;
        }
        if (**substmts[(long)fctx.ext_set.field_2].storage_p != 0) {
          free((void *)(**substmts[(long)fctx.ext_set.field_2].storage_p + -8));
        }
      }
      else {
        if (lVar2 == LY_STMT_BELONGS_TO) goto LAB_0019ac8f;
        if (lVar2 == LY_STMT_BIT) {
LAB_0019a5a8:
          lysp_type_enum_free((lysf_ctx *)auStack_40,
                              (lysp_type_enum *)*substmts[(long)fctx.ext_set.field_2].storage_p);
        }
        else if (lVar2 != LY_STMT_CONFIG) {
          if (lVar2 == LY_STMT_CONTACT) goto LAB_0019ac8f;
          if (lVar2 == LY_STMT_DEFAULT) {
LAB_0019aebf:
            c___11 = 0;
            while( true ) {
              if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                local_188 = 0;
              }
              else {
                local_188 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8);
              }
              if (local_188 <= c___11) break;
              lysp_qname_free(ctx,(lysp_qname *)
                                  ((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                  c___11 * 0x18));
              c___11 = c___11 + 1;
            }
            if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
              free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
            }
          }
          else {
            if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0019ac8f;
            if (lVar2 == LY_STMT_DEVIATE) {
              lysp_deviate_free((lysf_ctx *)auStack_40,
                                (lysp_deviate *)*substmts[(long)fctx.ext_set.field_2].storage_p);
            }
            else if (lVar2 == LY_STMT_DEVIATION) {
              lysp_deviation_free((lysf_ctx *)auStack_40,
                                  (lysp_deviation *)*substmts[(long)fctx.ext_set.field_2].storage_p)
              ;
            }
            else {
              if (lVar2 == LY_STMT_ENUM) goto LAB_0019a5a8;
              if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
              goto LAB_0019ac8f;
              if (lVar2 == LY_STMT_EXTENSION) {
                lysp_ext_free((lysf_ctx *)auStack_40,
                              (lysp_ext *)*substmts[(long)fctx.ext_set.field_2].storage_p);
              }
              else if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                c___2 = 0;
                while( true ) {
                  if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                    local_f8 = 0;
                  }
                  else {
                    local_f8 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8
                                         );
                  }
                  if (local_f8 <= c___2) break;
                  lysp_ext_instance_free
                            ((lysf_ctx *)auStack_40,
                             (lysp_ext_instance *)
                             ((long)*substmts[(long)fctx.ext_set.field_2].storage_p + c___2 * 0x70))
                  ;
                  c___2 = c___2 + 1;
                }
                if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                  free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
                }
              }
              else if (lVar2 == LY_STMT_FEATURE) {
                c___3 = 0;
                while( true ) {
                  if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                    local_108 = 0;
                  }
                  else {
                    local_108 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                          -8);
                  }
                  if (local_108 <= c___3) break;
                  lysp_feature_free((lysf_ctx *)auStack_40,
                                    (lysp_feature *)
                                    ((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                    c___3 * 0x40));
                  c___3 = c___3 + 1;
                }
                if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                  free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
                }
              }
              else if (lVar2 != LY_STMT_FRACTION_DIGITS) {
                if (lVar2 == LY_STMT_IDENTITY) {
                  c___4 = 0;
                  while( true ) {
                    if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                      local_118 = 0;
                    }
                    else {
                      local_118 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                            -8);
                    }
                    if (local_118 <= c___4) break;
                    lysp_ident_free((lysf_ctx *)auStack_40,
                                    (lysp_ident *)
                                    ((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                    c___4 * 0x38));
                    c___4 = c___4 + 1;
                  }
                  if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                    free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
                  }
                }
                else {
                  if (lVar2 == LY_STMT_IF_FEATURE) goto LAB_0019aebf;
                  if (lVar2 == LY_STMT_IMPORT) {
                    c___5 = 0;
                    while( true ) {
                      if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                        local_128 = 0;
                      }
                      else {
                        local_128 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p
                                              + -8);
                      }
                      if (local_128 <= c___5) break;
                      lysp_import_free((lysf_ctx *)auStack_40,
                                       (lysp_import *)
                                       ((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                       c___5 * 0x40));
                      c___5 = c___5 + 1;
                    }
                    if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                      free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
                    }
                  }
                  else if (lVar2 == LY_STMT_INCLUDE) {
                    c___6 = 0;
                    while( true ) {
                      if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                        local_138 = 0;
                      }
                      else {
                        local_138 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p
                                              + -8);
                      }
                      if (local_138 <= c___6) break;
                      lysp_include_free((lysf_ctx *)auStack_40,
                                        (lysp_include *)
                                        ((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                        c___6 * 0x38));
                      c___6 = c___6 + 1;
                    }
                    if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                      free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p + -8));
                    }
                  }
                  else {
                    if (lVar2 == LY_STMT_KEY) goto LAB_0019ac8f;
                    if (lVar2 == LY_STMT_LENGTH) goto LAB_0019acb3;
                    if (((lVar2 != LY_STMT_MANDATORY) && (lVar2 != LY_STMT_MAX_ELEMENTS)) &&
                       (lVar2 != LY_STMT_MIN_ELEMENTS)) {
                      if (lVar2 == LY_STMT_MODIFIER) goto LAB_0019ac8f;
                      if (lVar2 == LY_STMT_MODULE) {
LAB_0019b0e2:
                        lysp_module_free((lysf_ctx *)auStack_40,
                                         (lysp_module *)
                                         *substmts[(long)fctx.ext_set.field_2].storage_p);
                      }
                      else {
                        if (lVar2 == LY_STMT_MUST) goto LAB_0019acb3;
                        if (lVar2 == LY_STMT_NAMESPACE) goto LAB_0019ac8f;
                        if (lVar2 != LY_STMT_ORDERED_BY) {
                          if (lVar2 == LY_STMT_ORGANIZATION) goto LAB_0019ac8f;
                          if (lVar2 == LY_STMT_PATH) {
                            lyxp_expr_free(ctx,(lyxp_expr *)
                                               *substmts[(long)fctx.ext_set.field_2].storage_p);
                          }
                          else if (lVar2 == LY_STMT_PATTERN) {
LAB_0019acb3:
                            c___9 = 0;
                            while( true ) {
                              if (*substmts[(long)fctx.ext_set.field_2].storage_p == (void *)0x0) {
                                local_168 = 0;
                              }
                              else {
                                local_168 = *(ulong *)((long)*substmts[(long)fctx.ext_set.field_2].
                                                              storage_p + -8);
                              }
                              if (local_168 <= c___9) break;
                              lysp_restr_free((lysf_ctx *)auStack_40,
                                              (lysp_restr *)
                                              ((long)*substmts[(long)fctx.ext_set.field_2].storage_p
                                              + c___9 * 0x40));
                              c___9 = c___9 + 1;
                            }
                            if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0) {
                              free((void *)((long)*substmts[(long)fctx.ext_set.field_2].storage_p +
                                           -8));
                            }
                          }
                          else if (lVar2 != LY_STMT_POSITION) {
                            if ((lVar2 != LY_STMT_PREFIX) && (lVar2 != LY_STMT_PRESENCE)) {
                              if (lVar2 == LY_STMT_RANGE) goto LAB_0019acb3;
                              if (lVar2 != LY_STMT_REFERENCE) {
                                if (lVar2 == LY_STMT_REFINE) {
                                  c___7 = 0;
                                  while( true ) {
                                    if (*substmts[(long)fctx.ext_set.field_2].storage_p ==
                                        (void *)0x0) {
                                      local_148 = 0;
                                    }
                                    else {
                                      local_148 = *(ulong *)((long)*substmts[(long)fctx.ext_set.
                                                                                   field_2].
                                                                    storage_p + -8);
                                    }
                                    if (local_148 <= c___7) break;
                                    lysp_refine_free((lysf_ctx *)auStack_40,
                                                     (lysp_refine *)
                                                     ((long)*substmts[(long)fctx.ext_set.field_2].
                                                             storage_p + c___7 * 0x50));
                                    c___7 = c___7 + 1;
                                  }
                                  if (*substmts[(long)fctx.ext_set.field_2].storage_p != (void *)0x0
                                     ) {
                                    free((void *)((long)*substmts[(long)fctx.ext_set.field_2].
                                                         storage_p + -8));
                                  }
                                }
                                else if (lVar2 != LY_STMT_REQUIRE_INSTANCE) {
                                  if (lVar2 == LY_STMT_REVISION) {
                                    c___8 = 0;
                                    while( true ) {
                                      if (*substmts[(long)fctx.ext_set.field_2].storage_p ==
                                          (void *)0x0) {
                                        local_158 = 0;
                                      }
                                      else {
                                        local_158 = *(ulong *)((long)*substmts[(long)fctx.ext_set.
                                                                                     field_2].
                                                                      storage_p + -8);
                                      }
                                      if (local_158 <= c___8) break;
                                      lysp_revision_free((lysf_ctx *)auStack_40,
                                                         (lysp_revision *)
                                                         ((long)*substmts[(long)fctx.ext_set.field_2
                                                                         ].storage_p + c___8 * 0x28)
                                                        );
                                      c___8 = c___8 + 1;
                                    }
                                    if (*substmts[(long)fctx.ext_set.field_2].storage_p !=
                                        (void *)0x0) {
                                      free((void *)((long)*substmts[(long)fctx.ext_set.field_2].
                                                           storage_p + -8));
                                    }
                                  }
                                  else {
                                    if (lVar2 == LY_STMT_REVISION_DATE) goto LAB_0019ac8f;
                                    if (lVar2 != LY_STMT_STATUS) {
                                      if (lVar2 == LY_STMT_SUBMODULE) goto LAB_0019b0e2;
                                      if (lVar2 == LY_STMT_TYPE) {
                                        ppvVar4 = substmts[(long)fctx.ext_set.field_2].storage_p;
                                        lysp_type_free((lysf_ctx *)auStack_40,(lysp_type *)*ppvVar4)
                                        ;
                                        free(*ppvVar4);
                                      }
                                      else if (lVar2 == LY_STMT_TYPEDEF) {
                                        type_p = (lysp_type **)0x0;
                                        while( true ) {
                                          if (*substmts[(long)fctx.ext_set.field_2].storage_p ==
                                              (void *)0x0) {
                                            local_198 = (lysp_type **)0x0;
                                          }
                                          else {
                                            local_198 = *(lysp_type ***)
                                                         ((long)*substmts[(long)fctx.ext_set.field_2
                                                                         ].storage_p + -8);
                                          }
                                          if (local_198 <= type_p) break;
                                          lysp_tpdf_free((lysf_ctx *)auStack_40,
                                                         (lysp_tpdf *)
                                                         ((long)*substmts[(long)fctx.ext_set.field_2
                                                                         ].storage_p +
                                                         (long)type_p * 0xb0));
                                          type_p = (lysp_type **)((long)type_p + 1);
                                        }
                                        if (*substmts[(long)fctx.ext_set.field_2].storage_p !=
                                            (void *)0x0) {
                                          free((void *)((long)*substmts[(long)fctx.ext_set.field_2].
                                                               storage_p + -8));
                                        }
                                      }
                                      else {
                                        if (lVar2 == LY_STMT_UNIQUE) goto LAB_0019aebf;
                                        if (lVar2 == LY_STMT_UNITS) goto LAB_0019ac8f;
                                        if (lVar2 != LY_STMT_VALUE) {
                                          if (lVar2 == LY_STMT_WHEN) {
                                            c___10 = 0;
                                            while( true ) {
                                              if (*substmts[(long)fctx.ext_set.field_2].storage_p ==
                                                  (void *)0x0) {
                                                local_178 = 0;
                                              }
                                              else {
                                                local_178 = *(ulong *)((long)*substmts[(long)fctx.
                                                  ext_set.field_2].storage_p + -8);
                                              }
                                              if (local_178 <= c___10) break;
                                              lysp_when_free((lysf_ctx *)auStack_40,
                                                             (lysp_when *)
                                                             ((long)*substmts[(long)fctx.ext_set.
                                                                                    field_2].
                                                                     storage_p + c___10 * 0x20));
                                              c___10 = c___10 + 1;
                                            }
                                            if (*substmts[(long)fctx.ext_set.field_2].storage_p !=
                                                (void *)0x0) {
                                              free((void *)((long)*substmts[(long)fctx.ext_set.
                                                                                  field_2].storage_p
                                                           + -8));
                                            }
                                          }
                                          else if ((lVar2 != LY_STMT_YANG_VERSION) &&
                                                  (lVar2 != LY_STMT_YIN_ELEMENT)) {
                                            ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                                                  ,0x602);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                goto LAB_0019b12b;
                              }
                            }
                            goto LAB_0019ac8f;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0019b12b:
    fctx.ext_set.field_2.dnodes = fctx.ext_set.field_2.dnodes + 1;
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_pfree_instance_substatements(const struct ly_ctx *ctx, struct lysp_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            struct lysp_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysp_node_free(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_BASE:
            /* multiple strings */
            FREE_ARRAY(ctx, **(const char ***)substmts[u].storage_p, lydict_remove);
            break;

        case LY_STMT_BIT:
        case LY_STMT_ENUM:
            /* single enum */
            lysp_type_enum_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATE:
            /* single deviate */
            lysp_deviate_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATION:
            /* single deviation */
            lysp_deviation_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION:
            /* single extension */
            lysp_ext_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION_INSTANCE:
            /* multiple extension instances */
            FREE_ARRAY(&fctx, *(struct lysp_ext_instance **)substmts[u].storage_p, lysp_ext_instance_free);
            break;

        case LY_STMT_FEATURE:
            /* multiple features */
            FREE_ARRAY(&fctx, *(struct lysp_feature **)substmts[u].storage_p, lysp_feature_free);
            break;

        case LY_STMT_IDENTITY:
            /* multiple identities */
            FREE_ARRAY(&fctx, *(struct lysp_ident **)substmts[u].storage_p, lysp_ident_free);
            break;

        case LY_STMT_IMPORT:
            /* multiple imports */
            FREE_ARRAY(&fctx, *(struct lysp_import **)substmts[u].storage_p, lysp_import_free);
            break;

        case LY_STMT_INCLUDE:
            /* multiple includes */
            FREE_ARRAY(&fctx, *(struct lysp_include **)substmts[u].storage_p, lysp_include_free);
            break;

        case LY_STMT_REFINE:
            /* multiple refines */
            FREE_ARRAY(&fctx, *(struct lysp_refine **)substmts[u].storage_p, lysp_refine_free);
            break;

        case LY_STMT_REVISION:
            /* multiple revisions */
            FREE_ARRAY(&fctx, *(struct lysp_revision **)substmts[u].storage_p, lysp_revision_free);
            break;

        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_UNITS:
            /* single string */
            lydict_remove(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
            /* multiple restrictions */
            FREE_ARRAY(&fctx, *(struct lysp_restr **)substmts[u].storage_p, lysp_restr_free);
            break;

        case LY_STMT_WHEN:
            /* multiple whens */
            FREE_ARRAY(&fctx, *(struct lysp_when **)substmts[u].storage_p, lysp_when_free);
            break;

        case LY_STMT_PATH:
            /* single expression */
            lyxp_expr_free(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEFAULT:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_UNIQUE:
            /* multiple qnames */
            FREE_ARRAY(ctx, *(struct lysp_qname **)substmts[u].storage_p, lysp_qname_free);
            break;

        case LY_STMT_TYPEDEF:
            /* multiple typedefs */
            FREE_ARRAY(&fctx, *(struct lysp_tpdf **)substmts[u].storage_p, lysp_tpdf_free);
            break;

        case LY_STMT_TYPE: {
            /* single type */
            struct lysp_type **type_p = (struct lysp_type **)substmts[u].storage_p;

            lysp_type_free(&fctx, *type_p);
            free(*type_p);
            break;
        }
        case LY_STMT_MODULE:
        case LY_STMT_SUBMODULE:
            /* single (sub)module */
            lysp_module_free(&fctx, *substmts[u].storage_p);
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}